

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O3

void SetCloseOnExec(int fd)

{
  uint uVar1;
  int iVar2;
  char *__s;
  
  uVar1 = fcntl(fd,1);
  if ((int)uVar1 < 0) {
    __s = "fcntl(F_GETFD)";
  }
  else {
    iVar2 = fcntl(fd,2,(ulong)(uVar1 | 1));
    if (-1 < iVar2) {
      return;
    }
    __s = "fcntl(F_SETFD)";
  }
  perror(__s);
  return;
}

Assistant:

void SetCloseOnExec(int fd) {
#ifndef _WIN32
  int flags = fcntl(fd, F_GETFD);
  if (flags < 0) {
    perror("fcntl(F_GETFD)");
  } else {
    if (fcntl(fd, F_SETFD, flags | FD_CLOEXEC) < 0)
      perror("fcntl(F_SETFD)");
  }
#else
  HANDLE hd = (HANDLE) _get_osfhandle(fd);
  if (! SetHandleInformation(hd, HANDLE_FLAG_INHERIT, 0)) {
    fprintf(stderr, "SetHandleInformation(): %s", GetLastErrorString().c_str());
  }
#endif  // ! _WIN32
}